

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall rw::Engine::term(Engine *this)

{
  if ((engine == 0) && (state == 1)) {
    PluginList::close((int)this);
    d3d::nativeRasterOffset = 0;
    state = 0;
  }
  else {
    term();
  }
  return;
}

Assistant:

void
Engine::term(void)
{
	if(engine || Engine::state != Initialized){
		RWERROR((ERR_GENERAL));
		return;
	}

	PluginList::close();

	// This has to be reset because it won't be opened again otherwise
	// TODO: maybe reset more stuff here?
	d3d::nativeRasterOffset = 0;

	Engine::state = Dead;
}